

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter_test.c
# Opt level: O2

void test_counter_decrement(testing t)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint32_t uVar3;
  int iVar4;
  nsync_counter pnVar5;
  closure *pcVar6;
  char *pcVar7;
  ulong uVar8;
  nsync_time nVar10;
  nsync_time nVar11;
  closure_t_decrement_1 a1;
  closure_t_decrement_1 a1_00;
  nsync_time abs_deadline;
  nsync_time delay;
  __syscall_slong_t _Var9;
  
  pnVar5 = nsync::nsync_counter_new(1);
  nVar10 = nsync::nsync_time_now();
  nVar11 = nsync::nsync_time_ms(1000);
  _Var9 = nVar11.tv_nsec;
  nVar10 = nsync::nsync_time_add(nVar10,nVar11);
  a1.tv_sec = nVar10.tv_nsec;
  a1.tv_nsec = _Var9;
  pcVar6 = closure_decrement((_func_void_closure_t_decrement_0_closure_t_decrement_1 *)pnVar5,
                             (closure_t_decrement_0)nVar10.tv_sec,a1);
  closure_fork(pcVar6);
  nVar10 = nsync::nsync_time_now();
  nVar11.tv_nsec = _Var9;
  nVar11.tv_sec = 999999999;
  uVar3 = nsync::nsync_counter_wait((nsync *)pnVar5,(nsync_counter)0x7fffffffffffffff,nVar11);
  if (uVar3 != 0) {
    pcVar7 = smprintf("counter is not 0");
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O2/cpp/testing/counter_test.c"
                   ,0x67,pcVar7);
  }
  nVar11 = nsync::nsync_time_now();
  nVar10 = nsync::nsync_time_sub(nVar11,nVar10);
  nVar11 = nsync::nsync_time_ms(900);
  iVar4 = nsync::nsync_time_cmp(nVar10,nVar11);
  if (iVar4 < 0) {
    pcVar7 = nsync_time_str(nVar10,2);
    pcVar7 = smprintf("counter wait too fast (1s delay took %s)",pcVar7);
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O2/cpp/testing/counter_test.c"
                   ,0x6b,pcVar7);
  }
  nVar11 = nsync::nsync_time_ms(2000);
  uVar8 = nVar11.tv_nsec;
  iVar4 = nsync::nsync_time_cmp(nVar10,nVar11);
  if (0 < iVar4) {
    pcVar7 = nsync_time_str(nVar10,2);
    pcVar7 = smprintf("counter wait too slow (1s delay took %s)",pcVar7);
    uVar8 = 0x6e;
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O2/cpp/testing/counter_test.c"
                   ,0x6e,pcVar7);
  }
  uVar3 = nsync::nsync_counter_value(pnVar5);
  if (uVar3 != 0) {
    pcVar7 = smprintf("counter is not 0 (test)");
    uVar8 = 0x71;
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O2/cpp/testing/counter_test.c"
                   ,0x71,pcVar7);
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar8;
  uVar3 = nsync::nsync_counter_wait((nsync *)pnVar5,(nsync_counter)0x0,(nsync_time)(auVar1 << 0x40))
  ;
  if (uVar3 != 0) {
    pcVar7 = smprintf("counter is not 0 (poll)");
    uVar8 = 0x74;
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O2/cpp/testing/counter_test.c"
                   ,0x74,pcVar7);
  }
  nVar10.tv_nsec = uVar8;
  nVar10.tv_sec = 999999999;
  uVar3 = nsync::nsync_counter_wait((nsync *)pnVar5,(nsync_counter)0x7fffffffffffffff,nVar10);
  if (uVar3 != 0) {
    pcVar7 = smprintf("counter is not 0 (infinite wait)");
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O2/cpp/testing/counter_test.c"
                   ,0x77,pcVar7);
  }
  nsync::nsync_counter_free(pnVar5);
  pnVar5 = nsync::nsync_counter_new(1);
  nVar10 = nsync::nsync_time_now();
  nVar11 = nsync::nsync_time_ms(1000);
  _Var9 = nVar11.tv_nsec;
  nVar10 = nsync::nsync_time_add(nVar10,nVar11);
  a1_00.tv_sec = nVar10.tv_nsec;
  a1_00.tv_nsec = _Var9;
  pcVar6 = closure_decrement((_func_void_closure_t_decrement_0_closure_t_decrement_1 *)pnVar5,
                             (closure_t_decrement_0)nVar10.tv_sec,a1_00);
  closure_fork(pcVar6);
  nVar10 = nsync::nsync_time_now();
  while( true ) {
    uVar3 = nsync::nsync_counter_value(pnVar5);
    if (uVar3 == 0) break;
    nVar11 = nsync::nsync_time_ms(10);
    delay.tv_nsec = nVar11.tv_nsec;
    delay.tv_sec = delay.tv_nsec;
    nsync::nsync_time_sleep((nsync *)nVar11.tv_sec,delay);
  }
  nVar11 = nsync::nsync_time_now();
  nVar10 = nsync::nsync_time_sub(nVar11,nVar10);
  nVar11 = nsync::nsync_time_ms(900);
  iVar4 = nsync::nsync_time_cmp(nVar10,nVar11);
  if (iVar4 < 0) {
    pcVar7 = nsync_time_str(nVar10,2);
    pcVar7 = smprintf("counter wait too fast (1s delay took %s)",pcVar7);
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O2/cpp/testing/counter_test.c"
                   ,0x84,pcVar7);
  }
  nVar11 = nsync::nsync_time_ms(2000);
  uVar8 = nVar11.tv_nsec;
  iVar4 = nsync::nsync_time_cmp(nVar10,nVar11);
  if (0 < iVar4) {
    pcVar7 = nsync_time_str(nVar10,2);
    pcVar7 = smprintf("counter wait too slow (1s delay took %s)",pcVar7);
    uVar8 = 0x87;
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O2/cpp/testing/counter_test.c"
                   ,0x87,pcVar7);
  }
  uVar3 = nsync::nsync_counter_value(pnVar5);
  if (uVar3 != 0) {
    pcVar7 = smprintf("counter is not 0 (test)");
    uVar8 = 0x8a;
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O2/cpp/testing/counter_test.c"
                   ,0x8a,pcVar7);
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar8;
  uVar3 = nsync::nsync_counter_wait((nsync *)pnVar5,(nsync_counter)0x0,(nsync_time)(auVar2 << 0x40))
  ;
  if (uVar3 != 0) {
    pcVar7 = smprintf("counter is not 0 (poll)");
    uVar8 = 0x8d;
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O2/cpp/testing/counter_test.c"
                   ,0x8d,pcVar7);
  }
  abs_deadline.tv_nsec = uVar8;
  abs_deadline.tv_sec = 999999999;
  uVar3 = nsync::nsync_counter_wait((nsync *)pnVar5,(nsync_counter)0x7fffffffffffffff,abs_deadline);
  if (uVar3 != 0) {
    pcVar7 = smprintf("counter is not 0 (infinite wait)");
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O2/cpp/testing/counter_test.c"
                   ,0x90,pcVar7);
  }
  nsync::nsync_counter_free(pnVar5);
  return;
}

Assistant:

static void test_counter_decrement (testing t) {
	nsync_time start;
	nsync_time waited;
	nsync_counter c = nsync_counter_new (1);
	closure_fork (closure_decrement (&decrement_at, c,
		nsync_time_add (nsync_time_now (), nsync_time_ms (1000))));
	start = nsync_time_now ();
	if (nsync_counter_wait (c, nsync_time_no_deadline) != 0) {
		TEST_ERROR (t, ("counter is not 0"));
	}
	waited = nsync_time_sub (nsync_time_now (), start);
	if (nsync_time_cmp (waited, nsync_time_ms (900)) < 0) {
		TEST_ERROR (t, ("counter wait too fast (1s delay took %s)", nsync_time_str (waited, 2)));
	}
	if (nsync_time_cmp (waited, nsync_time_ms (2000)) > 0) {
		TEST_ERROR (t, ("counter wait too slow (1s delay took %s)", nsync_time_str (waited, 2)));
	}
	if (nsync_counter_value (c) != 0) {
		TEST_ERROR (t, ("counter is not 0 (test)"));
	}
	if (nsync_counter_wait (c, nsync_time_zero) != 0) {
		TEST_ERROR (t, ("counter is not 0 (poll)"));
	}
	if (nsync_counter_wait (c, nsync_time_no_deadline) != 0) {
		TEST_ERROR (t, ("counter is not 0 (infinite wait)"));
	}
	nsync_counter_free (c);

	c = nsync_counter_new (1);
	closure_fork (closure_decrement (&decrement_at, c,
		nsync_time_add (nsync_time_now (), nsync_time_ms (1000))));
	start = nsync_time_now ();
	while (nsync_counter_value (c) != 0) {
		nsync_time_sleep (nsync_time_ms (10));
	}
	waited = nsync_time_sub (nsync_time_now (), start);
	if (nsync_time_cmp (waited, nsync_time_ms (900)) < 0) {
		TEST_ERROR (t, ("counter wait too fast (1s delay took %s)", nsync_time_str (waited, 2)));
	}
	if (nsync_time_cmp (waited, nsync_time_ms (2000)) > 0) {
		TEST_ERROR (t, ("counter wait too slow (1s delay took %s)", nsync_time_str (waited, 2)));
	}
	if (nsync_counter_value (c) != 0) {
		TEST_ERROR (t, ("counter is not 0 (test)"));
	}
	if (nsync_counter_wait (c, nsync_time_zero) != 0) {
		TEST_ERROR (t, ("counter is not 0 (poll)"));
	}
	if (nsync_counter_wait (c, nsync_time_no_deadline) != 0) {
		TEST_ERROR (t, ("counter is not 0 (infinite wait)"));
	}
	nsync_counter_free (c);
}